

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O0

void csp_conn_init(void)

{
  csp_queue_handle_t ppVar1;
  int unaff_retaddr;
  csp_conn_t *conn;
  int i;
  csp_static_queue_t *in_stack_ffffffffffffffe8;
  csp_conn_t *buffer;
  undefined4 in_stack_fffffffffffffff8;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
    buffer = arr_conn + iVar2;
    arr_conn[iVar2].sport_outgoing = (char)iVar2 + '\x11';
    LOCK();
    arr_conn[iVar2].state = 0;
    UNLOCK();
    arr_conn[iVar2].idin.flags = '\0';
    ppVar1 = csp_queue_create_static
                       (unaff_retaddr,CONCAT44(iVar2,in_stack_fffffffffffffff8),(char *)buffer,
                        in_stack_ffffffffffffffe8);
    buffer->rx_queue = ppVar1;
    csp_rdp_init((csp_conn_t *)0x10771b);
  }
  return;
}

Assistant:

void csp_conn_init(void) {

	for (int i = 0; i < CSP_CONN_MAX; i++) {
		csp_conn_t * conn = &arr_conn[i];

		conn->sport_outgoing = CSP_PORT_MAX_BIND + 1 + i;
		conn->state = CONN_CLOSED;
		conn->idin.flags = 0;
		conn->rx_queue = csp_queue_create_static(CSP_CONN_RXQUEUE_LEN, sizeof(csp_packet_t *), conn->rx_queue_static_data, &conn->rx_queue_static);

#if (CSP_USE_RDP)
		csp_rdp_init(conn);
#endif
	}
}